

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
mxx::all2allv<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          unsigned_long *msgs,vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
          comm *comm)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  if ((long)(send_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(send_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != (long)comm->m_size) {
    assert_fail("send_sizes.size() == static_cast<size_t>(comm.size())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/collective.hpp"
                ,0x54e,"all2allv");
  }
  all2all<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,send_sizes,comm);
  all2allv<unsigned_long>
            (__return_storage_ptr__,msgs,send_sizes,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,comm);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2allv(const T* msgs, const std::vector<size_t>& send_sizes, const mxx::comm& comm = mxx::comm()) {
    // first get recv sizes
    MXX_ASSERT(send_sizes.size() == static_cast<size_t>(comm.size()));
    std::vector<size_t> recv_sizes = all2all(send_sizes, comm);
    return all2allv(msgs, send_sizes, recv_sizes, comm);
}